

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

IVec4 __thiscall tcu::getTextureBorderColorInt(tcu *this,TextureFormat *format,Sampler *sampler)

{
  ChannelType channelType;
  uint uVar1;
  int c;
  TextureSwizzle *pTVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  IVec4 IVar7;
  IVec4 valueMax;
  IVec4 valueMin;
  IVec4 channelBits;
  uint local_60 [4];
  uint local_50 [4];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  channelType = format->type;
  pTVar2 = getBorderColorReadSwizzle(format->order);
  getChannelBitDepth(channelType);
  local_60[0] = ~(-1 << ((char)local_40 - 1U & 0x1f));
  if (0x1f < local_40) {
    local_60[0] = 0x7fffffff;
  }
  lVar3 = 0;
  uVar5 = 0;
  if (local_40 < 1) {
    local_60[0] = uVar5;
  }
  local_60[1] = ~(-1 << ((char)local_3c - 1U & 0x1f));
  if (0x1f < local_3c) {
    local_60[1] = 0x7fffffff;
  }
  if (local_3c < 1) {
    local_60[1] = uVar5;
  }
  local_60[2] = ~(-1 << ((char)local_38 - 1U & 0x1f));
  if (0x1f < local_38) {
    local_60[2] = 0x7fffffff;
  }
  if (local_38 < 1) {
    local_60[2] = 0;
  }
  local_60[3] = ~(-1 << ((char)local_34 - 1U & 0x1f));
  if (0x1f < local_34) {
    local_60[3] = 0x7fffffff;
  }
  if (local_34 < 1) {
    local_60[3] = uVar5;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  do {
    lVar4 = (long)(int)pTVar2->components[lVar3];
    uVar6 = 0;
    if (lVar4 != 4) {
      if (pTVar2->components[lVar3] == CHANNEL_ONE) {
        uVar6 = 1;
      }
      else {
        uVar5 = (sampler->borderColor).v.iData[lVar4];
        uVar1 = local_60[lVar4];
        if ((int)uVar5 < (int)local_60[lVar4]) {
          uVar1 = uVar5;
        }
        uVar6 = (ulong)uVar1;
        if ((int)uVar5 < (int)local_50[lVar4]) {
          uVar6 = (ulong)local_50[lVar4];
        }
      }
    }
    *(int *)(this + lVar3 * 4) = (int)uVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  IVar7.m_data[2] = (int)uVar6;
  IVar7.m_data[3] = (int)(uVar6 >> 0x20);
  IVar7.m_data._0_8_ = this;
  return (IVec4)IVar7.m_data;
}

Assistant:

static tcu::IVec4 getTextureBorderColorInt (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const IVec4						valueMin		= getNBitSignedIntegerVec4MinValue(channelBits);
	const IVec4						valueMax		= getNBitSignedIntegerVec4MaxValue(channelBits);
	IVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<deInt32>()[(int)map], valueMin[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}